

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_encoder.h
# Opt level: O1

void __thiscall draco::AttributesEncoder::AddAttributeId(AttributesEncoder *this,int32_t id)

{
  iterator __position;
  int32_t local_10;
  value_type_conflict1 local_c;
  
  __position._M_current =
       (this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_10 = id;
  if (__position._M_current ==
      (this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->point_attribute_ids_,__position,&local_10);
  }
  else {
    *__position._M_current = id;
    (this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  if ((int)((ulong)((long)(this->point_attribute_to_local_id_map_).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->point_attribute_to_local_id_map_).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) <= local_10) {
    local_c = -1;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->point_attribute_to_local_id_map_,(long)local_10 + 1,&local_c);
  }
  (this->point_attribute_to_local_id_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[local_10] =
       (int)((ulong)((long)(this->point_attribute_ids_).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
  return;
}

Assistant:

void AddAttributeId(int32_t id) {
    point_attribute_ids_.push_back(id);
    if (id >= static_cast<int32_t>(point_attribute_to_local_id_map_.size())) {
      point_attribute_to_local_id_map_.resize(id + 1, -1);
    }
    point_attribute_to_local_id_map_[id] =
        static_cast<int32_t>(point_attribute_ids_.size()) - 1;
  }